

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat)

{
  pointer pMVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mat *pMVar7;
  Mat bottom_blob_unpacked;
  Mat local_68;
  
  iVar6 = -1;
  if ((-1 < blob_index) &&
     (pMVar1 = (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start,
     blob_index <
     (int)((ulong)((long)(this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) >> 6))) {
    iVar6 = 0;
    if (pMVar1[(uint)blob_index].dims == 0) {
      iVar6 = Net::forward_layer(this->net,
                                 (this->net->blobs).
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                                 .super__Vector_impl_data._M_start[(uint)blob_index].producer,
                                 &this->blob_mats,&this->opt);
    }
    pMVar7 = (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start + (uint)blob_index;
    if (pMVar7 != feat) {
      piVar2 = pMVar7->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = feat->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (feat->allocator == (Allocator *)0x0) {
            if (feat->data != (void *)0x0) {
              free(feat->data);
            }
          }
          else {
            (**(code **)(*(long *)feat->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&feat->refcount + 4) = 0;
      *(undefined8 *)((long)&feat->elemsize + 4) = 0;
      feat->data = (void *)0x0;
      feat->refcount = (int *)0x0;
      feat->dims = 0;
      feat->w = 0;
      feat->h = 0;
      feat->c = 0;
      feat->cstep = 0;
      piVar2 = pMVar7->refcount;
      feat->data = pMVar7->data;
      feat->refcount = piVar2;
      feat->elemsize = pMVar7->elemsize;
      feat->elempack = pMVar7->elempack;
      feat->allocator = pMVar7->allocator;
      iVar3 = pMVar7->w;
      iVar4 = pMVar7->h;
      iVar5 = pMVar7->c;
      feat->dims = pMVar7->dims;
      feat->w = iVar3;
      feat->h = iVar4;
      feat->c = iVar5;
      feat->cstep = pMVar7->cstep;
    }
    if ((this->opt).use_packing_layout == true) {
      local_68.elemsize._0_4_ = 0;
      local_68.elemsize._4_4_ = 0;
      local_68.elempack = 0;
      local_68.data = (void *)0x0;
      local_68.refcount._0_4_ = 0;
      local_68.refcount._4_4_ = 0;
      local_68.allocator = (Allocator *)0x0;
      local_68.dims = 0;
      local_68.w = 0;
      local_68.h = 0;
      local_68.c = 0;
      local_68.cstep = 0;
      convert_packing(feat,&local_68,1,&this->opt);
      if (&local_68 != feat) {
        piVar2 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = feat->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (feat->allocator == (Allocator *)0x0) {
              if (feat->data != (void *)0x0) {
                free(feat->data);
              }
            }
            else {
              (**(code **)(*(long *)feat->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&feat->refcount + 4) = 0;
        *(undefined8 *)((long)&feat->elemsize + 4) = 0;
        feat->data = (void *)0x0;
        feat->refcount = (int *)0x0;
        feat->dims = 0;
        feat->w = 0;
        feat->h = 0;
        feat->c = 0;
        feat->cstep = 0;
        feat->data = local_68.data;
        feat->refcount = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
        feat->elemsize = CONCAT44(local_68.elemsize._4_4_,(undefined4)local_68.elemsize);
        feat->elempack = local_68.elempack;
        feat->allocator = local_68.allocator;
        feat->dims = local_68.dims;
        feat->w = local_68.w;
        feat->h = local_68.h;
        feat->c = local_68.c;
        feat->cstep = local_68.cstep;
      }
      piVar2 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (**(code **)(*(long *)local_68.allocator + 0x18))();
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat)
{
    if (blob_index < 0 || blob_index >= (int)blob_mats.size())
        return -1;

    int ret = 0;

    if (blob_mats[blob_index].dims == 0)
    {
        int layer_index = net->blobs[blob_index].producer;

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            // use local allocator
            if (!opt.blob_vkallocator)
            {
                local_blob_vkallocator = net->vkdev->acquire_blob_allocator();
                opt.blob_vkallocator = local_blob_vkallocator;
            }
            if (!opt.workspace_vkallocator)
            {
                opt.workspace_vkallocator = opt.blob_vkallocator;
            }
            if (!opt.staging_vkallocator)
            {
                local_staging_vkallocator = net->vkdev->acquire_staging_allocator();
                opt.staging_vkallocator = local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(net->vkdev);
#if NCNN_BENCHMARK
            cmd.create_query_pool(net->layers.size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, blob_mats[blob_index], opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(net->layers.size() * 2);
                    cmd.get_query_pool_results(0, net->layers.size() * 2, results);
                    for (size_t i=0; i<net->layers.size(); i++)
                    {
                        uint64_t start = results[i*2];
                        uint64_t end = results[i*2+1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * net->vkdev->info.timestamp_period / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", net->layers[i]->type.c_str(), net->layers[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, blob_mats[blob_index], opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(net->layers.size() * 2);
                    cmd.get_query_pool_results(0, net->layers.size() * 2, results);
                    for (size_t i=0; i<net->layers.size(); i++)
                    {
                        uint64_t start = results[i*2];
                        uint64_t end = results[i*2+1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * net->vkdev->info.timestamp_period / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", net->layers[i]->type.c_str(), net->layers[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = net->forward_layer(layer_index, blob_mats, opt);
        }
#else
        ret = net->forward_layer(layer_index, blob_mats, opt);
#endif // NCNN_VULKAN

    }

    feat = blob_mats[blob_index];

    if (opt.use_packing_layout)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, opt);
        feat = bottom_blob_unpacked;
    }

    return ret;
}